

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

CURLcode Curl_urldecode(char *string,size_t length,char **ostring,size_t *olen,urlreject ctrl)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  CURLcode CVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  char hexstr [3];
  char *ptr;
  
  if (length == 0) {
    length = strlen(string);
  }
  pcVar5 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar5 == (char *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar7 = 0;
    sVar8 = length + 1;
    while (uVar6 = sVar8 - 1, uVar6 != 0) {
      bVar3 = *string;
      if ((uVar6 < 3) || (bVar3 != 0x25)) {
LAB_00446480:
        if ((ctrl == REJECT_CTRL && bVar3 < 0x20) || (ctrl == REJECT_ZERO && bVar3 == 0)) {
          (*Curl_cfree)(pcVar5);
          return CURLE_URL_MALFORMAT;
        }
      }
      else {
        bVar1 = ((byte *)string)[1];
        if ((byte)(bVar1 - 0x30) < 10) {
LAB_0044642e:
          bVar2 = ((byte *)string)[2];
          if (9 < (byte)(bVar2 - 0x30)) {
            bVar3 = 0x25;
            if ((0x25 < bVar2 - 0x41) ||
               ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0)) goto LAB_004464a3;
          }
          string = (char *)((byte *)string + 2);
          hexstr[2] = '\0';
          hexstr[0] = bVar1;
          hexstr[1] = bVar2;
          uVar6 = strtoul(hexstr,&ptr,0x10);
          bVar3 = curlx_ultouc(uVar6);
          uVar6 = sVar8 - 3;
          goto LAB_00446480;
        }
        bVar3 = 0x25;
        if ((bVar1 - 0x41 < 0x26) && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))
        goto LAB_0044642e;
      }
LAB_004464a3:
      pcVar5[sVar7] = bVar3;
      sVar7 = sVar7 + 1;
      string = (char *)((byte *)string + 1);
      sVar8 = uVar6;
    }
    pcVar5[sVar7] = '\0';
    if (olen != (size_t *)0x0) {
      *olen = sVar7;
    }
    *ostring = pcVar5;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_urldecode(const char *string, size_t length,
                        char **ostring, size_t *olen,
                        enum urlreject ctrl)
{
  size_t alloc;
  char *ns;
  size_t strindex = 0;
  unsigned long hex;

  DEBUGASSERT(string);
  DEBUGASSERT(ctrl >= REJECT_NADA); /* crash on TRUE/FALSE */

  alloc = (length?length:strlen(string)) + 1;
  ns = malloc(alloc);

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      string += 2;
      alloc -= 2;
    }

    if(((ctrl == REJECT_CTRL) && (in < 0x20)) ||
       ((ctrl == REJECT_ZERO) && (in == 0))) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex] = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}